

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

QList<QCss::Declaration> * __thiscall
QCss::StyleSelector::declarationsForNode
          (QList<QCss::Declaration> *__return_storage_ptr__,StyleSelector *this,NodePtr node,
          char *extraPseudo)

{
  Selector *this_00;
  bool bVar1;
  quint64 qVar2;
  int i;
  undefined1 *puVar3;
  long lVar4;
  long in_FS_OFFSET;
  QLatin1StringView local_88;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<QCss::StyleRule> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (Declaration *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (StyleRule *)&DAT_aaaaaaaaaaaaaaaa;
  styleRulesForNode((QList<QCss::StyleRule> *)&local_58,this,node);
  lVar4 = 0x18;
  puVar3 = (undefined1 *)0x0;
  do {
    if ((ulong)local_58.size <= puVar3) {
      QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer(&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    this_00 = *(Selector **)((long)local_58.ptr + lVar4 + -0x10);
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    Selector::pseudoElement((QString *)&local_78,this_00);
    if (extraPseudo == (char *)0x0) {
LAB_005451cc:
      if ((undefined1 *)local_78.size == (undefined1 *)0x0) {
        qVar2 = Selector::pseudoClass(this_00,(quint64 *)0x0);
        if ((qVar2 == 0x100) || (qVar2 == 1)) goto LAB_005451ec;
      }
    }
    else {
      local_88.m_size = QtPrivate::lengthHelperPointer<char>(extraPseudo);
      local_88.m_data = extraPseudo;
      bVar1 = ::operator==((QString *)&local_78,&local_88);
      if (!bVar1) goto LAB_005451cc;
LAB_005451ec:
      QList<QCss::Declaration>::append
                (__return_storage_ptr__,
                 (QList<QCss::Declaration> *)((long)&((local_58.ptr)->selectors).d.d + lVar4));
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    puVar3 = puVar3 + 1;
    lVar4 = lVar4 + 0x38;
  } while( true );
}

Assistant:

QList<Declaration> StyleSelector::declarationsForNode(NodePtr node, const char *extraPseudo)
{
    QList<Declaration> decls;
    QList<StyleRule> rules = styleRulesForNode(node);
    for (int i = 0; i < rules.size(); i++) {
        const Selector& selector = rules.at(i).selectors.at(0);
        const QString pseudoElement = selector.pseudoElement();

        if (extraPseudo && pseudoElement == QLatin1StringView(extraPseudo)) {
            decls += rules.at(i).declarations;
            continue;
        }

        if (!pseudoElement.isEmpty()) // skip rules with pseudo elements
            continue;
        quint64 pseudoClass = selector.pseudoClass();
        if (pseudoClass == PseudoClass_Enabled || pseudoClass == PseudoClass_Unspecified)
            decls += rules.at(i).declarations;
    }
    return decls;
}